

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::EntryPointInfo::DumpNativeThrowSpanSequence(EntryPointInfo *this)

{
  Type TVar1;
  SmallSpanSequence *this_00;
  StatementData SVar2;
  int iVar3;
  BOOL BVar4;
  NativeEntryPointData *pNVar5;
  DWORD_PTR DVar6;
  ptrdiff_t pVar7;
  long lVar8;
  Type index;
  SmallSpanSequenceIter local_58;
  EntryPointInfo *local_40;
  StatementData local_38;
  StatementData data;
  
  pNVar5 = GetNativeEntryPointData(this);
  this_00 = pNVar5->nativeThrowSpanSequence;
  if (this_00 != (SmallSpanSequence *)0x0) {
    DVar6 = GetNativeAddress(this);
    pVar7 = GetCodeSize(this);
    Output::Print(L"Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"
                  ,DVar6,pVar7);
    if (this_00->pStatementBuffer != (GrowingUint32HeapArray *)0x0) {
      TVar1 = this_00->pStatementBuffer->count;
      local_58.accumulatedIndex = -1;
      local_58.accumulatedSourceBegin = 0;
      local_58.accumulatedBytecodeBegin = 0;
      local_58.indexOfActualOffset = 0;
      if (0 < (int)TVar1) {
        index = 0;
        local_40 = this;
        do {
          local_38.sourceBegin = 0;
          local_38.bytecodeBegin = 0;
          BVar4 = SmallSpanSequence::Item(this_00,index,&local_58,&local_38);
          SVar2 = local_38;
          if (BVar4 != 0) {
            iVar3 = local_38.bytecodeBegin;
            lVar8 = (long)local_38.bytecodeBegin;
            DVar6 = GetNativeAddress(local_40);
            Output::Print(L"S%4d, (%5d -----)  (0x%012Ix --------)\n",(ulong)SVar2 & 0xffffffff,
                          (ulong)(uint)iVar3,lVar8 + DVar6);
          }
          index = index + 1;
        } while (TVar1 != index);
      }
    }
  }
  return;
}

Assistant:

void EntryPointInfo::DumpNativeThrowSpanSequence()
    {
        // Native Throw Map
        SmallSpanSequence * nativeThrowSpanSequence = this->GetNativeEntryPointData()->GetNativeThrowSpanSequence();
        if (nativeThrowSpanSequence)
        {
            Output::Print(_u("Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"),
                          this->GetNativeAddress(),
                          this->GetCodeSize());

            int count = nativeThrowSpanSequence->Count();
            SmallSpanSequenceIter iter;
            for (int i = 0; i < count; i++)
            {
                StatementData data;
                if (nativeThrowSpanSequence->Item(i, iter, data))
                {
                    Output::Print(_u("S%4d, (%5d -----)  (0x%012Ix --------)\n"), data.sourceBegin, // statementIndex
                        data.bytecodeBegin, // nativeOffset
                        data.bytecodeBegin + this->GetNativeAddress());
                }
            }
        }
    }